

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared_statement.cpp
# Opt level: O1

unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
__thiscall
duckdb::PreparedStatement::PendingQuery
          (PreparedStatement *this,vector<duckdb::Value,_true> *values,bool allow_stream_result)

{
  ulong __val;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  __uniq_ptr_impl<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
  _Var2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  char cVar5;
  reference other;
  mapped_type *this_01;
  ulong uVar6;
  undefined7 in_register_00000011;
  vector<duckdb::Value,_true> *this_02;
  char cVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  string __str;
  case_insensitive_map_t<BoundParameterData> named_values;
  key_type local_148;
  case_insensitive_map_t<BoundParameterData> *local_128;
  __uniq_ptr_impl<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
  local_120;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  BoundParameterData local_100;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_a8;
  Value local_70;
  
  this_02 = (vector<duckdb::Value,_true> *)CONCAT71(in_register_00000011,allow_stream_result);
  local_a8._M_buckets = &local_a8._M_single_bucket;
  local_a8._M_bucket_count = 1;
  local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8._M_element_count = 0;
  local_a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8._M_rehash_policy._M_next_resize = 0;
  local_a8._M_single_bucket = (__node_base_ptr)0x0;
  local_128 = (case_insensitive_map_t<BoundParameterData> *)values;
  local_120._M_t.
  super__Tuple_impl<0UL,_duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>
  .super__Head_base<0UL,_duckdb::PendingQueryResult_*,_false>._M_head_impl =
       (tuple<duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>)
       (tuple<duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>)this;
  if ((this_02->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this_02->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar6 = 0;
    do {
      other = vector<duckdb::Value,_true>::operator[](this_02,uVar6);
      Value::Value(&local_70,other);
      BoundParameterData::BoundParameterData(&local_100,&local_70);
      __val = uVar6 + 1;
      cVar7 = '\x01';
      if (8 < uVar6) {
        uVar6 = __val;
        cVar5 = '\x04';
        do {
          cVar7 = cVar5;
          if (uVar6 < 100) {
            cVar7 = cVar7 + -2;
            goto LAB_00fcd146;
          }
          if (uVar6 < 1000) {
            cVar7 = cVar7 + -1;
            goto LAB_00fcd146;
          }
          if (uVar6 < 10000) goto LAB_00fcd146;
          bVar1 = 99999 < uVar6;
          uVar6 = uVar6 / 10000;
          cVar5 = cVar7 + '\x04';
        } while (bVar1);
        cVar7 = cVar7 + '\x01';
      }
LAB_00fcd146:
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&local_148,cVar7);
      ::std::__detail::__to_chars_10_impl<unsigned_long>
                (local_148._M_dataplus._M_p,(uint)local_148._M_string_length,__val);
      this_01 = ::std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&local_a8,&local_148);
      Value::operator=(&this_01->value,&local_100.value);
      _Var4._M_pi = local_100.return_type.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      peVar3 = local_100.return_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (this_01->return_type).id_ = local_100.return_type.id_;
      (this_01->return_type).physical_type_ = local_100.return_type.physical_type_;
      uVar8 = *(undefined4 *)
               &(this_01->return_type).type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar9 = *(undefined4 *)
               ((long)&(this_01->return_type).type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               + 4);
      uVar10 = *(undefined4 *)
                &(this_01->return_type).type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
      uVar11 = *(undefined4 *)
                ((long)&(this_01->return_type).type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 4);
      (this_01->return_type).type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (this_01->return_type).type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_100.return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_100.return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (this_01->return_type).type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (this_01->return_type).type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
      (this_01->return_type).type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var4._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_118 = uVar8;
        uStack_114 = uVar9;
        uStack_110 = uVar10;
        uStack_10c = uVar11;
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        uVar8 = local_118;
        uVar9 = uStack_114;
        uVar10 = uStack_110;
        uVar11 = uStack_10c;
      }
      _Var4._M_pi = local_100.return_type.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      local_100.return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)CONCAT44(uVar9,uVar8);
      local_100.return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = uVar11;
      local_100.return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = uVar10;
      if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
      LogicalType::~LogicalType(&local_100.return_type);
      Value::~Value(&local_100.value);
      Value::~Value(&local_70);
      uVar6 = __val;
    } while (__val < (ulong)((long)(this_02->
                                   super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_02->
                                   super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 6));
  }
  _Var2._M_t.
  super__Tuple_impl<0UL,_duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>
  .super__Head_base<0UL,_duckdb::PendingQueryResult_*,_false>._M_head_impl =
       local_120._M_t.
       super__Tuple_impl<0UL,_duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>
       .super__Head_base<0UL,_duckdb::PendingQueryResult_*,_false>._M_head_impl;
  PendingQuery((PreparedStatement *)
               local_120._M_t.
               super__Tuple_impl<0UL,_duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>
               .super__Head_base<0UL,_duckdb::PendingQueryResult_*,_false>._M_head_impl,local_128,
               SUB81(&local_a8,0));
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_a8);
  return (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         (_Tuple_impl<0UL,_duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>
          )_Var2._M_t.
           super__Tuple_impl<0UL,_duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>
           .super__Head_base<0UL,_duckdb::PendingQueryResult_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<PendingQueryResult> PreparedStatement::PendingQuery(vector<Value> &values, bool allow_stream_result) {
	case_insensitive_map_t<BoundParameterData> named_values;
	for (idx_t i = 0; i < values.size(); i++) {
		auto &val = values[i];
		named_values[std::to_string(i + 1)] = BoundParameterData(val);
	}
	return PendingQuery(named_values, allow_stream_result);
}